

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::DefaultPerThreadTestPartResultReporter::ReportTestPartResult
          (DefaultPerThreadTestPartResultReporter *this,TestPartResult *result)

{
  TestPartResultReporterInterface *pTVar1;
  undefined8 extraout_RDX;
  
  pTVar1 = UnitTestImpl::GetGlobalTestPartResultReporter(this->unit_test_);
  (*pTVar1->_vptr_TestPartResultReporterInterface[2])
            (pTVar1,result,extraout_RDX,pTVar1->_vptr_TestPartResultReporterInterface[2]);
  return;
}

Assistant:

void DefaultPerThreadTestPartResultReporter::ReportTestPartResult(
    const TestPartResult& result) {
  unit_test_->GetGlobalTestPartResultReporter()->ReportTestPartResult(result);
}